

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O2

void asm_guardcc(ASMState *as,int cc)

{
  MCode *pMVar1;
  int iVar2;
  MCode *p;
  int iVar3;
  byte bVar4;
  long lStack_8;
  
  bVar4 = (byte)cc;
  pMVar1 = as->mcp;
  iVar3 = (as->snapno & 0x1f) * 4 + (int)as->J->exitstubgroup[as->snapno >> 5];
  iVar2 = (int)pMVar1;
  if (pMVar1 == as->invmcp) {
    as->loopinv = 1;
    *(int *)(pMVar1 + 1) = (iVar3 - iVar2) + -5;
    bVar4 = bVar4 ^ 1;
    iVar3 = iVar2;
    if (as->realign != (MCode *)0x0) {
      pMVar1[-1] = '\0';
      bVar4 = bVar4 & 0xf | 0x70;
      lStack_8 = -2;
      goto LAB_00136202;
    }
  }
  *(int *)(pMVar1 + -4) = iVar3 - iVar2;
  pMVar1[-5] = bVar4 & 0xf | 0x80;
  bVar4 = 0xf;
  lStack_8 = -6;
LAB_00136202:
  pMVar1[lStack_8] = bVar4;
  as->mcp = pMVar1 + lStack_8;
  return;
}

Assistant:

static void asm_guardcc(ASMState *as, int cc)
{
  MCode *target = exitstub_addr(as->J, as->snapno);
  MCode *p = as->mcp;
  if (LJ_UNLIKELY(p == as->invmcp)) {
    as->loopinv = 1;
    *(int32_t *)(p+1) = jmprel(as->J, p+5, target);
    target = p;
    cc ^= 1;
    if (as->realign) {
      if (LJ_GC64 && LJ_UNLIKELY(as->mrm.base == RID_RIP))
	as->mrm.ofs += 2;  /* Fixup RIP offset for pending fused load. */
      emit_sjcc(as, cc, target);
      return;
    }
  }
  if (LJ_GC64 && LJ_UNLIKELY(as->mrm.base == RID_RIP))
    as->mrm.ofs += 6;  /* Fixup RIP offset for pending fused load. */
  emit_jcc(as, cc, target);
}